

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O0

Instr * Peeps::PeepBranch(BranchInstr *branchInstr,bool *peepedRef)

{
  byte bVar1;
  undefined2 uVar2;
  code *pcVar3;
  bool bVar4;
  IRKind IVar5;
  BOOL BVar6;
  LabelInstr *pLVar7;
  Instr *pIVar8;
  JITTimeFunctionBody *this;
  Opnd *pOVar9;
  RegOpnd *this_00;
  StackSym *this_01;
  ByteCodeUsesInstr *this_02;
  undefined4 *puVar10;
  BranchInstr *pBVar11;
  LabelInstr *pLVar12;
  MultiBranchInstr *this_03;
  bool local_c1;
  bool local_b2;
  bool local_b1;
  bool local_a1;
  MultiBranchInstr *multiBranchInstr;
  BranchInstr *uncondBranch;
  Instr *instrPrev;
  ByteCodeUsesInstr *byteCodeUsesInstr;
  StackSym *symSrc;
  RegOpnd *regSrc;
  Instr *newInstr;
  OpCode newOpcode;
  Instr *instrTmp;
  Instr *instrSkip;
  Instr *instrNext;
  LabelInstr *targetInstr;
  bool *peepedRef_local;
  BranchInstr *branchInstr_local;
  
  if (peepedRef != (bool *)0x0) {
    *peepedRef = false;
  }
  pLVar7 = IR::BranchInstr::GetTarget(branchInstr);
  bVar4 = IR::BranchInstr::IsUnconditional(branchInstr);
  if (bVar4) {
    RemoveDeadBlock((branchInstr->super_Instr).m_next,(bool *)0x0);
  }
  pIVar8 = IR::Instr::GetNextRealInstrOrLabel(&branchInstr->super_Instr);
  if (pIVar8 != (Instr *)0x0) {
    IVar5 = IR::Instr::GetKind(pIVar8);
    local_a1 = true;
    if (IVar5 != InstrKindLabel) {
      local_a1 = IR::Instr::IsProfiledLabelInstr(pIVar8);
    }
    instrTmp = pIVar8;
    if (local_a1 != false) {
      while( true ) {
        local_b1 = false;
        if ((LabelInstr *)instrTmp != pLVar7) {
          IVar5 = IR::Instr::GetKind(instrTmp);
          local_b2 = true;
          if (IVar5 != InstrKindLabel) {
            local_b2 = IR::Instr::IsProfiledLabelInstr(instrTmp);
          }
          local_b1 = local_b2;
        }
        if (local_b1 == false) break;
        instrTmp = IR::Instr::GetNextRealInstrOrLabel(instrTmp);
      }
      IVar5 = IR::Instr::GetKind(instrTmp);
      local_c1 = true;
      if (IVar5 != InstrKindLabel) {
        local_c1 = IR::Instr::IsProfiledLabelInstr(instrTmp);
      }
      instrSkip = pIVar8;
      if (local_c1 != false) {
        if (pIVar8 == instrTmp) {
          instrTmp = (Instr *)0x0;
        }
        else {
          pLVar12 = IR::Instr::AsLabelInstr(pIVar8);
          bVar1 = pLVar12->field_0x78;
          pLVar12 = IR::Instr::AsLabelInstr(instrTmp);
          if ((bVar1 >> 1 & 1) != ((byte)pLVar12->field_0x78 >> 1 & 1)) {
            pLVar12 = IR::Instr::AsLabelInstr(pIVar8);
            pLVar12->field_0x78 = pLVar12->field_0x78 & 0xdf | 0x20;
          }
          pLVar12 = IR::Instr::AsLabelInstr(instrTmp);
          bVar1 = pLVar12->field_0x78;
          pLVar12 = IR::Instr::AsLabelInstr(pIVar8);
          pLVar12->field_0x78 = pLVar12->field_0x78 & 0xfd | (bVar1 >> 1 & 1) << 1;
          instrSkip = instrTmp;
          instrTmp = pIVar8;
        }
      }
      if (pLVar7 != (LabelInstr *)instrSkip) goto LAB_00839ea5;
      bVar4 = IR::Instr::IsLowered(&branchInstr->super_Instr);
      if (bVar4) goto LAB_00839c77;
      bVar4 = IR::Instr::HasAnyImplicitCalls(&branchInstr->super_Instr);
      if (!bVar4) {
        pOVar9 = IR::Instr::GetSrc1(&branchInstr->super_Instr);
        if ((pOVar9 != (Opnd *)0x0) &&
           (pOVar9 = IR::Instr::GetSrc2(&branchInstr->super_Instr), pOVar9 == (Opnd *)0x0)) {
          pOVar9 = IR::Instr::GetSrc1(&branchInstr->super_Instr);
          bVar4 = IR::Opnd::IsRegOpnd(pOVar9);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x222,"(branchInstr->GetSrc1()->IsRegOpnd())",
                               "branchInstr->GetSrc1()->IsRegOpnd()");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          pOVar9 = IR::Instr::GetSrc1(&branchInstr->super_Instr);
          this_00 = IR::Opnd::AsRegOpnd(pOVar9);
          this_01 = IR::Opnd::GetStackSym(&this_00->super_Opnd);
          bVar4 = StackSym::HasByteCodeRegSlot(this_01);
          if ((bVar4) && (bVar4 = IR::Opnd::GetIsJITOptimizedReg(&this_00->super_Opnd), !bVar4)) {
            this_02 = IR::ByteCodeUsesInstr::New(&branchInstr->super_Instr);
            IR::ByteCodeUsesInstr::Set(this_02,&this_00->super_Opnd);
            IR::Instr::InsertBefore(&branchInstr->super_Instr,&this_02->super_Instr);
          }
        }
        goto LAB_00839c77;
      }
      this = Func::GetJITFunctionBody((branchInstr->super_Instr).m_func);
      bVar4 = JITTimeFunctionBody::IsAsmJsMode(this);
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                           ,0x1ed,"(!branchInstr->m_func->GetJITFunctionBody()->IsAsmJsMode())",
                           "!branchInstr->m_func->GetJITFunctionBody()->IsAsmJsMode()");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      uVar2 = (branchInstr->super_Instr).m_opcode;
      if ((ushort)(uVar2 - 0xc) < 2) {
LAB_00839a4c:
        newInstr._6_2_ = DeadBrEqual;
      }
      else if ((ushort)(uVar2 - 0x10) < 4) {
LAB_00839a62:
        newInstr._6_2_ = DeadBrRelational;
      }
      else if ((ushort)(uVar2 - 0x14) < 2) {
LAB_00839a57:
        newInstr._6_2_ = DeadBrSrEqual;
      }
      else {
        if (1 < (ushort)(uVar2 - 0x102)) {
          if (3 < (ushort)(uVar2 - 0x18e)) {
            if ((ushort)(uVar2 - 0x194) < 2) goto LAB_00839a4c;
            if ((ushort)(uVar2 - 0x196) < 2) goto LAB_00839a57;
            if (3 < (ushort)(uVar2 - 0x198)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                                 ,0x216,"((0))","UNREACHED");
              if (!bVar4) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
              newInstr._6_2_ = Nop;
              goto LAB_00839ae5;
            }
          }
          goto LAB_00839a62;
        }
        newInstr._6_2_ = DeadBrOnHasProperty;
      }
LAB_00839ae5:
      pIVar8 = IR::Instr::New(newInstr._6_2_,(branchInstr->super_Instr).m_func);
      pOVar9 = IR::Instr::GetSrc1(&branchInstr->super_Instr);
      IR::Instr::SetSrc1(pIVar8,pOVar9);
      pOVar9 = IR::Instr::GetSrc2(&branchInstr->super_Instr);
      IR::Instr::SetSrc2(pIVar8,pOVar9);
      IR::Instr::InsertBefore(&branchInstr->super_Instr,pIVar8);
      IR::Instr::SetByteCodeOffset(pIVar8,&branchInstr->super_Instr);
LAB_00839c77:
      if (peepedRef != (bool *)0x0) {
        *peepedRef = true;
      }
      IR::Instr::Remove(&branchInstr->super_Instr);
      BVar6 = IR::LabelInstr::IsUnreferenced(pLVar7);
      instrSkip = &pLVar7->super_Instr;
      if (BVar6 != 0) {
        instrSkip = PeepUnreachableLabel(pLVar7,false,(bool *)0x0);
      }
      pIVar8 = IR::Instr::GetPrevRealInstrOrLabel(instrSkip);
      bVar4 = IR::Instr::IsBranchInstr(pIVar8);
      if (!bVar4) {
        if (instrTmp != (Instr *)0x0) {
          return instrTmp;
        }
        return instrSkip;
      }
      pBVar11 = IR::Instr::AsBranchInstr(pIVar8);
      pIVar8 = PeepBranch(pBVar11,(bool *)0x0);
      return pIVar8;
    }
  }
  bVar4 = IR::BranchInstr::IsConditional(branchInstr);
  if (bVar4) {
    if (pIVar8 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,0x251,"(instrNext)","instrNext");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    bVar4 = IR::Instr::IsBranchInstr(pIVar8);
    if (bVar4) {
      pBVar11 = IR::Instr::AsBranchInstr(pIVar8);
      bVar4 = IR::BranchInstr::IsUnconditional(pBVar11);
      if (bVar4) {
        pBVar11 = IR::Instr::AsBranchInstr(pIVar8);
        pLVar12 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(&pBVar11->super_Instr);
        if (pLVar7 == pLVar12) {
          pBVar11 = IR::Instr::AsBranchInstr(pIVar8);
          bVar4 = IR::BranchInstr::IsMultiBranch(pBVar11);
          if (!bVar4) {
            pBVar11 = IR::Instr::AsBranchInstr(pIVar8);
            bVar4 = IR::Instr::IsLowered(&branchInstr->super_Instr);
            if (bVar4) {
              LowererMD::InvertBranch(branchInstr);
            }
            else {
              IR::BranchInstr::Invert(branchInstr);
            }
            pLVar7 = IR::BranchInstr::GetTarget(pBVar11);
            IR::BranchInstr::SetTarget(branchInstr,pLVar7);
            BVar6 = IR::LabelInstr::IsUnreferenced(pLVar7);
            if (BVar6 != 0) {
              PeepUnreachableLabel(pLVar7,false,(bool *)0x0);
            }
            IR::Instr::Remove(&pBVar11->super_Instr);
            pIVar8 = PeepBranch(branchInstr,peepedRef);
            return pIVar8;
          }
        }
      }
    }
  }
LAB_00839ea5:
  bVar4 = IR::BranchInstr::IsMultiBranch(branchInstr);
  if (bVar4) {
    this_03 = IR::BranchInstr::AsMultiBrInstr(branchInstr);
    IR::MultiBranchInstr::UpdateMultiBrLabels<Peeps::PeepBranch(IR::BranchInstr*,bool*)::__0>
              (this_03,(anon_class_8_1_d53a6cca_for_fn)branchInstr);
  }
  else {
    RetargetBrToBr(branchInstr,pLVar7);
  }
  return (branchInstr->super_Instr).m_next;
}

Assistant:

IR::Instr *
Peeps::PeepBranch(IR::BranchInstr *branchInstr, bool *const peepedRef)
{
    if(peepedRef)
    {
        *peepedRef = false;
    }

    IR::LabelInstr *targetInstr = branchInstr->GetTarget();
    IR::Instr *instrNext;

    if (branchInstr->IsUnconditional())
    {
        // Cleanup unreachable code after unconditional branch
        instrNext = RemoveDeadBlock(branchInstr->m_next);
    }

    instrNext = branchInstr->GetNextRealInstrOrLabel();

    if (instrNext != NULL && instrNext->IsLabelInstr())
    {
        //
        // Remove branch-to-next
        //
        IR::Instr * instrSkip = instrNext;
        while (instrSkip != targetInstr && instrSkip->IsLabelInstr())
        {
            // Skip adjacent labels
            instrSkip = instrSkip->GetNextRealInstrOrLabel();
        }
        if (instrSkip->IsLabelInstr())
        {
            if (instrNext == instrSkip)
            {
                instrSkip = nullptr;
            }
            else
            {
                IR::Instr *instrTmp = instrSkip;

                // Ignore assertion error for cases where we insert an "airlock" helper block
                // for a Branch instruction's helper path that:
                //  1) ends up being empty
                //  2) comes after a helper block from another instruction
                //  3) is followed by a non-helper block
                //
                // Propagating the "isOpHelper" flag can potentially make this block a non-helper,
                // and that makes this block only reachable through helper blocks, thus failing the assert 
#if DBG
                if (instrNext->AsLabelInstr()->isOpHelper != instrSkip->AsLabelInstr()->isOpHelper)
                {
                    instrNext->AsLabelInstr()->m_noHelperAssert = true;
                }
#endif
                instrNext->AsLabelInstr()->isOpHelper = instrSkip->AsLabelInstr()->isOpHelper;
                instrSkip = instrNext;
                instrNext = instrTmp;
            }
        }
        if (targetInstr == instrNext)
        {
            if (!branchInstr->IsLowered())
            {
                if (branchInstr->HasAnyImplicitCalls())
                {
                    Assert(!branchInstr->m_func->GetJITFunctionBody()->IsAsmJsMode());
                    // if (x > y) might trigger a call to valueof() or something for x and y.
                    // We can't just delete them.
                    Js::OpCode newOpcode;
                    switch(branchInstr->m_opcode)
                    {
                    case Js::OpCode::BrEq_A:
                    case Js::OpCode::BrNeq_A:
                    case Js::OpCode::BrNotEq_A:
                    case Js::OpCode::BrNotNeq_A:
                        newOpcode = Js::OpCode::DeadBrEqual;
                        break;

                    case Js::OpCode::BrSrEq_A:
                    case Js::OpCode::BrSrNeq_A:
                    case Js::OpCode::BrSrNotEq_A:
                    case Js::OpCode::BrSrNotNeq_A:
                        newOpcode = Js::OpCode::DeadBrSrEqual;
                        break;

                    case Js::OpCode::BrGe_A:
                    case Js::OpCode::BrGt_A:
                    case Js::OpCode::BrLe_A:
                    case Js::OpCode::BrLt_A:
                    case Js::OpCode::BrNotGe_A:
                    case Js::OpCode::BrNotGt_A:
                    case Js::OpCode::BrNotLe_A:
                    case Js::OpCode::BrNotLt_A:
                    case Js::OpCode::BrUnGe_A:
                    case Js::OpCode::BrUnGt_A:
                    case Js::OpCode::BrUnLe_A:
                    case Js::OpCode::BrUnLt_A:
                        newOpcode = Js::OpCode::DeadBrRelational;
                        break;

                    case Js::OpCode::BrOnHasProperty:
                    case Js::OpCode::BrOnNoProperty:
                        newOpcode = Js::OpCode::DeadBrOnHasProperty;
                        break;

                    default:
                        Assert(UNREACHED);
                        newOpcode = Js::OpCode::Nop;
                    }
                    IR::Instr *newInstr = IR::Instr::New(newOpcode, branchInstr->m_func);
                    newInstr->SetSrc1(branchInstr->GetSrc1());
                    newInstr->SetSrc2(branchInstr->GetSrc2());
                    branchInstr->InsertBefore(newInstr);
                    newInstr->SetByteCodeOffset(branchInstr);
                }
                else if (branchInstr->GetSrc1() && !branchInstr->GetSrc2())
                {
                    // We only have cases with one src
                    Assert(branchInstr->GetSrc1()->IsRegOpnd());

                    IR::RegOpnd *regSrc = branchInstr->GetSrc1()->AsRegOpnd();
                    StackSym *symSrc = regSrc->GetStackSym();

                    if (symSrc->HasByteCodeRegSlot() && !regSrc->GetIsJITOptimizedReg())
                    {
                        // No side-effects to worry about, but need to insert bytecodeUse.
                        IR::ByteCodeUsesInstr *byteCodeUsesInstr = IR::ByteCodeUsesInstr::New(branchInstr);
                        byteCodeUsesInstr->Set(regSrc);
                        branchInstr->InsertBefore(byteCodeUsesInstr);
                    }
                }
            }
            // Note: if branch is conditional, we have a dead test/cmp left behind...
            if(peepedRef)
            {
                *peepedRef = true;
            }
            branchInstr->Remove();
            if (targetInstr->IsUnreferenced())
            {
                // We may have exposed an unreachable label by deleting the branch
                instrNext = Peeps::PeepUnreachableLabel(targetInstr, false);
            }
            else
            {
                instrNext = targetInstr;
            }
            IR::Instr *instrPrev = instrNext->GetPrevRealInstrOrLabel();
            if (instrPrev->IsBranchInstr())
            {
                // The branch removal could have exposed a branch to next opportunity.
                return Peeps::PeepBranch(instrPrev->AsBranchInstr());
            }
            if (instrSkip)
            {
                return instrSkip;
            }
            else
            {
                return instrNext;
            }
        }
    }
    else if (branchInstr->IsConditional())
    {
        AnalysisAssert(instrNext);
        if (instrNext->IsBranchInstr()
            && instrNext->AsBranchInstr()->IsUnconditional()
            && targetInstr == instrNext->AsBranchInstr()->GetNextRealInstrOrLabel()
            && !instrNext->AsBranchInstr()->IsMultiBranch())
        {
            //
            // Invert condBranch/uncondBranch/label:
            //
            //      JCC L1                   JinvCC L3
            //      JMP L3       =>
            //      L1:
            IR::BranchInstr *uncondBranch = instrNext->AsBranchInstr();

            if (branchInstr->IsLowered())
            {
                LowererMD::InvertBranch(branchInstr);
            }
            else
            {
                branchInstr->Invert();
            }

            targetInstr = uncondBranch->GetTarget();
            branchInstr->SetTarget(targetInstr);
            if (targetInstr->IsUnreferenced())
            {
                Peeps::PeepUnreachableLabel(targetInstr, false);
            }

            uncondBranch->Remove();

            return PeepBranch(branchInstr, peepedRef);
        }
    }

    if(branchInstr->IsMultiBranch())
    {
        IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

        multiBranchInstr->UpdateMultiBrLabels([=](IR::LabelInstr * targetInstr) -> IR::LabelInstr *
        {
            IR::LabelInstr * labelInstr = RetargetBrToBr(branchInstr, targetInstr);
            return labelInstr;
        });
    }
    else
    {
        RetargetBrToBr(branchInstr, targetInstr);
    }

    return branchInstr->m_next;
}